

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O3

int climateToBiome(int mc,uint64_t *np,uint64_t *dat)

{
  int iVar1;
  long lVar2;
  uint64_t uVar3;
  long lVar4;
  ulong uVar5;
  BiomeTree *bt;
  uint64_t *puVar6;
  
  if (mc < 0x1c) {
    if (mc < 0x19) {
      if (mc == 0x18) {
        bt = &climateToBiome::btree19;
      }
      else {
        bt = &climateToBiome::btree18;
        if (0x16 < mc) {
          bt = &climateToBiome::btree192;
        }
      }
    }
    else {
      bt = &climateToBiome::btree20;
    }
  }
  else {
    bt = &climateToBiome::btree21wd;
  }
  if (dat == (uint64_t *)0x0) {
    iVar1 = get_resulting_node(np,bt,0,0,0xffffffffffffffff,0);
    puVar6 = bt->nodes;
    uVar3 = (uint64_t)iVar1;
  }
  else {
    puVar6 = bt->nodes;
    lVar2 = 0;
    uVar3 = 0;
    do {
      uVar5 = (ulong)(((uint)(puVar6[(int)*dat] >> ((byte)lVar2 & 0x3f)) & 0xff) * 2);
      lVar4 = *(long *)((long)np + lVar2) - (long)bt->param[uVar5 + 1];
      if ((lVar4 < 1) && (lVar4 = (long)bt->param[uVar5] - *(long *)((long)np + lVar2), lVar4 < 1))
      {
        lVar4 = 0;
      }
      uVar3 = uVar3 + lVar4 * lVar4;
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x30);
    iVar1 = get_resulting_node(np,bt,0,(int)*dat,uVar3,0);
    uVar3 = (uint64_t)iVar1;
    *dat = uVar3;
  }
  return (int)*(byte *)((long)puVar6 + uVar3 * 8 + 6);
}

Assistant:

int climateToBiome(int mc, const uint64_t np[6], uint64_t *dat)
{
    static const BiomeTree btree18 = {
        btree18_steps, &btree18_param[0][0], btree18_nodes, btree18_order,
        sizeof(btree18_nodes) / sizeof(uint64_t)
    };
    static const BiomeTree btree192 = {
        btree192_steps, &btree192_param[0][0], btree192_nodes, btree192_order,
        sizeof(btree192_nodes) / sizeof(uint64_t)
    };
    static const BiomeTree btree19 = {
        btree19_steps, &btree19_param[0][0], btree19_nodes, btree19_order,
        sizeof(btree19_nodes) / sizeof(uint64_t)
    };
    static const BiomeTree btree20 = {
        btree20_steps, &btree20_param[0][0], btree20_nodes, btree20_order,
        sizeof(btree20_nodes) / sizeof(uint64_t)
    };
    static const BiomeTree btree21wd = {
        btree21wd_steps, &btree21wd_param[0][0], btree21wd_nodes, btree21wd_order,
        sizeof(btree21wd_nodes) / sizeof(uint64_t)
    };

    const BiomeTree *bt;
    int idx;

    if (mc >= MC_1_21_WD)
        bt = &btree21wd;
    else if (mc >= MC_1_20_6)
        bt = &btree20;
    else if (mc >= MC_1_19_4)
        bt = &btree19;
    else if (mc >= MC_1_19_2)
        bt = &btree192;
    else
        bt = &btree18;

    if (dat)
    {
        int alt = (int) *dat;
        uint64_t ds = get_np_dist(np, bt, alt);
        idx = get_resulting_node(np, bt, 0, alt, ds, 0);
        *dat = (uint64_t) idx;
    }
    else
    {
        idx = get_resulting_node(np, bt, 0, 0, -1, 0);
    }

    return (bt->nodes[idx] >> 48) & 0xFF;
}